

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O1

SPxId __thiscall
soplex::SPxHarrisRT<double>::selectEnter
          (SPxHarrisRT<double> *this,double *val,int param_2,bool param_3)

{
  double dVar1;
  uint uVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long *plVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  long *plVar8;
  long *plVar9;
  long *plVar10;
  long *plVar11;
  Real RVar12;
  bool bVar13;
  int iVar14;
  int iVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  double *pdVar16;
  undefined4 extraout_var_10;
  long lVar17;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  long lVar18;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  _func_int **pp_Var19;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  long lVar20;
  long lVar21;
  ulong uVar22;
  double dVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  uint extraout_XMM0_Dd_00;
  uint uVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  uint local_154;
  double local_148;
  double local_138;
  double max;
  SPxId enterId;
  undefined4 local_108;
  uint uStack_104;
  undefined4 local_f8;
  uint uStack_f4;
  double rmaxabs;
  double cmaxabs;
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  uint local_98;
  uint uStack_94;
  uint uStack_8c;
  undefined1 local_88 [16];
  double local_70;
  undefined1 local_68 [16];
  double local_58;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  SSVectorBase<double> *local_38;
  undefined4 extraout_var_11;
  undefined4 extraout_var_21;
  undefined4 extraout_var_29;
  
  enterId.super_DataKey.info = 0;
  enterId.super_DataKey.idx = -1;
  max = 0.0;
  cmaxabs = 1.0;
  rmaxabs = 1.0;
  peVar3 = (this->super_SPxRatioTester<double>)._tolerances.
           super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->super_SPxRatioTester<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  dVar1 = peVar3->s_epsilon_multiplier;
  uVar22 = -(ulong)(dVar1 == 1.0);
  local_b8._8_8_ = 0;
  local_b8._0_8_ = ~uVar22 & (ulong)(dVar1 * 0.0001) | uVar22 & 0x3f1a36e2eb1c432d;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  RVar12 = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var,iVar14) + 0x1b8));
  local_a8._8_4_ = extraout_XMM0_Dc;
  local_a8._0_8_ = RVar12;
  local_a8._12_4_ = extraout_XMM0_Dd;
  dVar1 = degenerateEps(this);
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar4 = *(long **)(CONCAT44(extraout_var_00,iVar14) + 0x6c0);
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar5 = *(long *)(CONCAT44(extraout_var_01,iVar14) + 0x6c0);
  local_38 = (SSVectorBase<double> *)(lVar5 + 0x20);
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar6 = *(long **)(CONCAT44(extraout_var_02,iVar14) + 0x6b8);
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar7 = *(long *)(CONCAT44(extraout_var_03,iVar14) + 0x6b8);
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar8 = *(long **)(CONCAT44(extraout_var_04,iVar14) + 0x6d8);
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar9 = *(long **)(CONCAT44(extraout_var_05,iVar14) + 0x6e0);
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar10 = *(long **)(CONCAT44(extraout_var_06,iVar14) + 0x6e8);
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar11 = *(long **)(CONCAT44(extraout_var_07,iVar14) + 0x6f0);
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_08,iVar14) + 0x6b8) + 0x20));
  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_09,iVar14) + 0x6c0) + 0x20));
  local_108 = SUB84(dVar1,0);
  uStack_104 = (uint)((ulong)dVar1 >> 0x20);
  if (*val <= (double)local_a8._0_8_) {
    local_148 = 0.0;
    if (*val < -(double)local_a8._0_8_) {
      pdVar16 = (double *)__tls_get_addr(&PTR_003b6b60);
      local_58 = *pdVar16;
      uStack_94 = uStack_104 ^ 0x80000000;
      uStack_8c = extraout_XMM0_Dd_00 ^ 0x80000000;
      local_98 = local_108;
LAB_00235e9d:
      do {
        do {
          max = *val;
          iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          local_70 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_23,iVar14) + 0x368))
                                       ((long *)CONCAT44(extraout_var_23,iVar14));
          minDelta(this,&rmaxabs,&max,*(int *)(lVar5 + 0x28),*(int **)(lVar5 + 0x30),
                   *(double **)(lVar5 + 0x40),(double *)*plVar4,(double *)*plVar9,(double *)*plVar8)
          ;
          minDelta(this,&cmaxabs,&max,*(int *)(lVar7 + 0x28),*(int **)(lVar7 + 0x30),
                   *(double **)(lVar7 + 0x40),(double *)*plVar6,(double *)*plVar11,
                   (double *)*plVar10);
          if ((max == *val) && (!NAN(max) && !NAN(*val))) {
            return (SPxId)enterId.super_DataKey;
          }
          ::soplex::infinity::__tls_init();
          local_88._8_8_ = 0;
          local_88._0_8_ = cmaxabs * (double)local_a8._0_8_;
          local_154 = 0xffffffff;
          if ((long)*(int *)(lVar5 + 0x28) < 1) {
            local_138 = 0.0;
            uVar2 = 0xffffffff;
            local_148 = local_58;
          }
          else {
            local_68._0_8_ = rmaxabs * (double)local_a8._0_8_ * 0.001;
            local_68._8_8_ = 0;
            local_48._8_8_ = 0x8000000000000000;
            local_48._0_8_ = -(double)local_68._0_8_;
            lVar21 = (long)*(int *)(lVar5 + 0x28) + 1;
            uVar2 = 0xffffffff;
            local_138 = 0.0;
            local_148 = local_58;
            do {
              lVar18 = *(long *)(lVar5 + 0x30);
              uVar26 = *(uint *)(lVar18 + -8 + lVar21 * 4);
              lVar20 = (long)(int)uVar26;
              dVar27 = *(double *)(*(long *)(lVar5 + 0x40) + lVar20 * 8);
              if (dVar27 <= (double)local_68._0_8_) {
                if ((double)local_48._0_8_ <= dVar27) {
                  *(undefined8 *)(*(long *)(lVar5 + 0x40) + lVar20 * 8) = 0;
                  iVar14 = *(int *)(lVar5 + 0x28);
                  *(int *)(lVar5 + 0x28) = iVar14 + -1;
                  *(undefined4 *)(lVar18 + -8 + lVar21 * 4) =
                       *(undefined4 *)(lVar18 + -4 + (long)iVar14 * 4);
                }
                else {
                  dVar23 = *(double *)(*plVar8 + lVar20 * 8) - *(double *)(*plVar4 + lVar20 * 8);
                  if (dVar23 < (double)CONCAT44(uStack_94,local_98)) {
                    iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                    lVar17 = CONCAT44(extraout_var_25,iVar14);
                    dVar27 = *(double *)(*plVar4 + lVar20 * 8);
                    uVar24 = SUB84(dVar27,0);
                    uVar25 = (undefined4)((ulong)dVar27 >> 0x20);
                    lVar18 = **(long **)(lVar17 + 0x6d8);
                    dVar23 = *(double *)(lVar18 + lVar20 * 8);
                    dVar29 = dVar27 - dVar23;
                    dVar27 = (double)-(ulong)(dVar23 < dVar27);
                    goto LAB_002360ee;
                  }
                  dVar23 = dVar23 / dVar27;
                  if ((max <= dVar23) && (local_138 < -dVar27)) {
                    pp_Var19 = (this->super_SPxRatioTester<double>)._vptr_SPxRatioTester;
                    local_148 = dVar23;
                    local_138 = -dVar27;
                    goto LAB_00236195;
                  }
                }
              }
              else {
                dVar23 = *(double *)(*plVar9 + lVar20 * 8) - *(double *)(*plVar4 + lVar20 * 8);
                if (dVar1 < dVar23) {
                  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                  lVar17 = CONCAT44(extraout_var_24,iVar14);
                  dVar23 = *(double *)(*plVar4 + lVar20 * 8);
                  uVar24 = SUB84(dVar23,0);
                  uVar25 = (undefined4)((ulong)dVar23 >> 0x20);
                  lVar18 = **(long **)(lVar17 + 0x6e0);
                  dVar27 = *(double *)(lVar18 + lVar20 * 8);
                  dVar29 = (double)-(ulong)(dVar23 < dVar27);
                  dVar27 = dVar27 - dVar23;
LAB_002360ee:
                  *(double *)(lVar17 + 0x380) =
                       (double)((ulong)dVar27 & (ulong)dVar29) + *(double *)(lVar17 + 0x380);
                  *(ulong *)(lVar18 + lVar20 * 8) = CONCAT44(uVar25,uVar24);
                }
                else {
                  dVar23 = dVar23 / dVar27;
                  if ((max <= dVar23) && (local_138 < dVar27)) {
                    pp_Var19 = (this->super_SPxRatioTester<double>)._vptr_SPxRatioTester;
                    local_148 = dVar23;
                    local_138 = dVar27;
LAB_00236195:
                    iVar14 = (*pp_Var19[3])(this);
                    enterId = SPxSolverBase<double>::id
                                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_26,iVar14),
                                         uVar26);
                    uVar2 = uVar26;
                  }
                }
              }
              lVar21 = lVar21 + -1;
            } while (1 < lVar21);
          }
          if (0 < (long)*(int *)(lVar7 + 0x28)) {
            uVar24 = local_88._8_4_;
            uVar26 = local_88._12_4_;
            dVar27 = local_88._0_8_ * 0.001;
            local_88._8_4_ = uVar24;
            local_88._0_8_ = dVar27;
            local_88._12_4_ = uVar26;
            local_68._8_4_ = uVar24;
            local_68._0_8_ = -dVar27;
            local_68._12_4_ = uVar26 ^ 0x80000000;
            local_154 = 0xffffffff;
            lVar21 = (long)*(int *)(lVar7 + 0x28);
            do {
              lVar18 = *(long *)(lVar7 + 0x30);
              iVar14 = *(int *)(lVar18 + -4 + lVar21 * 4);
              lVar20 = (long)iVar14;
              dVar27 = *(double *)(*(long *)(lVar7 + 0x40) + lVar20 * 8);
              if (dVar27 <= (double)local_88._0_8_) {
                if ((double)local_68._0_8_ <= dVar27) {
                  *(undefined8 *)(*(long *)(lVar7 + 0x40) + lVar20 * 8) = 0;
                  iVar14 = *(int *)(lVar7 + 0x28);
                  *(int *)(lVar7 + 0x28) = iVar14 + -1;
                  *(undefined4 *)(lVar18 + -4 + lVar21 * 4) =
                       *(undefined4 *)(lVar18 + -4 + (long)iVar14 * 4);
                }
                else {
                  dVar23 = *(double *)(*plVar10 + lVar20 * 8) - *(double *)(*plVar6 + lVar20 * 8);
                  if (dVar23 < (double)CONCAT44(uStack_94,local_98)) {
                    iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                    lVar17 = CONCAT44(extraout_var_28,iVar14);
                    dVar27 = *(double *)(*plVar6 + lVar20 * 8);
                    uVar24 = SUB84(dVar27,0);
                    uVar25 = (undefined4)((ulong)dVar27 >> 0x20);
                    lVar18 = **(long **)(lVar17 + 0x6e8);
                    dVar23 = *(double *)(lVar18 + lVar20 * 8);
                    dVar29 = dVar27 - dVar23;
                    dVar27 = (double)-(ulong)(dVar23 < dVar27);
                    goto LAB_00236349;
                  }
                  dVar23 = dVar23 / dVar27;
                  if ((max <= dVar23) && (local_138 < -dVar27)) {
                    pp_Var19 = (this->super_SPxRatioTester<double>)._vptr_SPxRatioTester;
                    local_148 = dVar23;
                    local_138 = -dVar27;
                    goto LAB_002363e4;
                  }
                }
              }
              else {
                dVar23 = *(double *)(*plVar11 + lVar20 * 8) - *(double *)(*plVar6 + lVar20 * 8);
                if (dVar23 <= dVar1) {
                  dVar23 = dVar23 / dVar27;
                  if ((max <= dVar23) && (local_138 < dVar27)) {
                    pp_Var19 = (this->super_SPxRatioTester<double>)._vptr_SPxRatioTester;
                    local_148 = dVar23;
                    local_138 = dVar27;
LAB_002363e4:
                    iVar15 = (*pp_Var19[3])(this);
                    enterId = SPxSolverBase<double>::coId
                                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_29,iVar15),
                                         iVar14);
                    local_154 = (uint)(lVar21 + -1);
                  }
                }
                else {
                  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                  lVar17 = CONCAT44(extraout_var_27,iVar14);
                  dVar23 = *(double *)(*plVar6 + lVar20 * 8);
                  uVar24 = SUB84(dVar23,0);
                  uVar25 = (undefined4)((ulong)dVar23 >> 0x20);
                  lVar18 = **(long **)(lVar17 + 0x6f0);
                  dVar27 = *(double *)(lVar18 + lVar20 * 8);
                  dVar29 = (double)-(ulong)(dVar23 < dVar27);
                  dVar27 = dVar27 - dVar23;
LAB_00236349:
                  *(double *)(lVar17 + 0x380) =
                       (double)((ulong)dVar27 & (ulong)dVar29) + *(double *)(lVar17 + 0x380);
                  *(ulong *)(lVar18 + lVar20 * 8) = CONCAT44(uVar25,uVar24);
                }
              }
              bVar13 = 1 < lVar21;
              lVar21 = lVar21 + -1;
            } while (bVar13);
          }
          iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          dVar27 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_30,iVar14) + 0x368))
                                     ((long *)CONCAT44(extraout_var_30,iVar14));
        } while ((local_70 != dVar27) || (NAN(local_70) || NAN(dVar27)));
        if (-1 < (int)local_154) {
          iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          bVar13 = SPxSolverBase<double>::isBasic
                             ((SPxSolverBase<double> *)CONCAT44(extraout_var_31,iVar14),&enterId);
          if (!bVar13) break;
          lVar21 = *(long *)(lVar7 + 0x30);
          *(undefined8 *)
           (*(long *)(lVar7 + 0x40) + (long)*(int *)(lVar21 + (ulong)local_154 * 4) * 8) = 0;
          iVar14 = *(int *)(lVar7 + 0x28);
          *(int *)(lVar7 + 0x28) = iVar14 + -1;
          *(undefined4 *)(lVar21 + (ulong)local_154 * 4) =
               *(undefined4 *)(lVar21 + -4 + (long)iVar14 * 4);
          goto LAB_00235e9d;
        }
        if ((int)uVar2 < 0) goto LAB_0023670b;
        iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        lVar21 = *(long *)(CONCAT44(extraout_var_32,iVar14) + 0x480);
        lVar18 = *(long *)(lVar21 + 0x20);
        uVar22 = (ulong)uVar2;
        lVar21 = (long)*(int *)(*(long *)(lVar21 + 0x28) + 4 + uVar22 * 8);
        iVar14 = *(int *)(lVar18 + 0xc + lVar21 * 0x28);
        if (iVar14 < 1) {
          dVar27 = 0.0;
        }
        else {
          pdVar16 = *(double **)(lVar18 + lVar21 * 0x28);
          iVar14 = iVar14 + 1;
          dVar29 = 0.0;
          dVar23 = 0.0;
          do {
            dVar28 = *pdVar16 * *(double *)(*plVar6 + (long)*(int *)(pdVar16 + 1) * 8);
            dVar27 = dVar23 + dVar28;
            dVar29 = dVar29 + (dVar28 - (dVar27 - dVar23)) + (dVar23 - (dVar27 - (dVar27 - dVar23)))
            ;
            pdVar16 = pdVar16 + 2;
            iVar14 = iVar14 + -1;
            dVar23 = dVar27;
          } while (1 < iVar14);
          dVar27 = dVar27 + dVar29;
        }
        *(double *)(*plVar4 + uVar22 * 8) = dVar27;
        iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        bVar13 = SPxSolverBase<double>::isBasic
                           ((SPxSolverBase<double> *)CONCAT44(extraout_var_33,iVar14),&enterId);
        if (bVar13) {
          SSVectorBase<double>::setValue(local_38,uVar2,0.0);
          goto LAB_00235e9d;
        }
        dVar27 = *(double *)(*(long *)(lVar5 + 0x40) + uVar22 * 8);
        local_148 = *(double *)(*plVar4 + uVar22 * 8);
        if (dVar27 <= 0.0) {
          local_148 = *(double *)(*plVar8 + uVar22 * 8) - local_148;
          if ((-dVar27 < (double)local_b8._0_8_) &&
             (local_148 < (this->super_SPxRatioTester<double>).delta)) {
            iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            lVar18 = CONCAT44(extraout_var_35,iVar14);
            dVar27 = *(double *)(*plVar4 + uVar22 * 8);
            uVar24 = SUB84(dVar27,0);
            uVar25 = (undefined4)((ulong)dVar27 >> 0x20);
            lVar21 = **(long **)(lVar18 + 0x6d8);
            dVar23 = *(double *)(lVar21 + uVar22 * 8);
            dVar29 = dVar27 - dVar23;
            dVar27 = (double)-(ulong)(dVar23 < dVar27);
            goto LAB_002366ad;
          }
        }
        else {
          local_148 = *(double *)(*plVar9 + uVar22 * 8) - local_148;
          if ((dVar27 < (double)local_b8._0_8_) &&
             (-local_148 < (this->super_SPxRatioTester<double>).delta)) {
            iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            lVar18 = CONCAT44(extraout_var_34,iVar14);
            dVar23 = *(double *)(*plVar4 + uVar22 * 8);
            uVar24 = SUB84(dVar23,0);
            uVar25 = (undefined4)((ulong)dVar23 >> 0x20);
            lVar21 = **(long **)(lVar18 + 0x6e0);
            dVar27 = *(double *)(lVar21 + uVar22 * 8);
            dVar29 = (double)-(ulong)(dVar23 < dVar27);
            dVar27 = dVar27 - dVar23;
LAB_002366ad:
            *(double *)(lVar18 + 0x380) =
                 (double)((ulong)dVar27 & (ulong)dVar29) + *(double *)(lVar18 + 0x380);
            *(ulong *)(lVar21 + uVar22 * 8) = CONCAT44(uVar25,uVar24);
            uVar24 = local_b8._12_4_;
            local_b8._8_4_ = local_b8._8_4_;
            local_b8._0_8_ = local_b8._0_8_ * 0.5;
            local_b8._12_4_ = uVar24;
            goto LAB_00235e9d;
          }
        }
        local_148 = local_148 / dVar27;
      } while (local_148 < max);
    }
  }
  else {
    pdVar16 = (double *)__tls_get_addr(&PTR_003b6b60);
    local_58 = -*pdVar16;
    uStack_50 = 0;
    uStack_4c = 0x80000000;
    local_68._0_8_ = (ulong)dVar1 ^ 0x8000000000000000;
    local_68._8_4_ = local_f8;
    local_68._12_4_ = uStack_f4 ^ 0x80000000;
LAB_002355f4:
    do {
      do {
        max = *val;
        iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        dVar27 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar14) + 0x368))
                                   ((long *)CONCAT44(extraout_var_10,iVar14));
        maxDelta(this,&rmaxabs,&max,*(int *)(lVar5 + 0x28),*(int **)(lVar5 + 0x30),
                 *(double **)(lVar5 + 0x40),(double *)*plVar4,(double *)*plVar9,(double *)*plVar8);
        maxDelta(this,&cmaxabs,&max,*(int *)(lVar7 + 0x28),*(int **)(lVar7 + 0x30),
                 *(double **)(lVar7 + 0x40),(double *)*plVar6,(double *)*plVar11,(double *)*plVar10)
        ;
        if ((max == *val) && (!NAN(max) && !NAN(*val))) {
          return (SPxId)enterId.super_DataKey;
        }
        ::soplex::infinity::__tls_init();
        local_70 = cmaxabs * 0.001;
        local_98 = 0xffffffff;
        dVar23 = (double)local_a8._0_8_;
        uVar22 = local_a8._8_8_;
        if ((long)*(int *)(lVar5 + 0x28) < 1) {
          local_138 = 0.0;
          local_154 = 0xffffffff;
          local_148 = local_58;
        }
        else {
          dVar29 = rmaxabs * 0.001 * (double)local_a8._0_8_;
          local_88._0_8_ = local_a8._0_8_;
          if ((double)local_a8._0_8_ <= dVar29) {
            local_88._0_8_ = dVar29;
          }
          local_88._8_8_ = local_a8._8_8_;
          local_48._8_8_ = local_a8._8_8_ ^ 0x8000000000000000;
          local_48._0_8_ = -(double)local_88._0_8_;
          lVar21 = (long)*(int *)(lVar5 + 0x28) + 1;
          local_154 = 0xffffffff;
          local_138 = 0.0;
          local_148 = local_58;
          do {
            lVar18 = *(long *)(lVar5 + 0x30);
            uVar2 = *(uint *)(lVar18 + -8 + lVar21 * 4);
            lVar20 = (long)(int)uVar2;
            dVar29 = *(double *)(*(long *)(lVar5 + 0x40) + lVar20 * 8);
            if (dVar29 <= (double)local_88._0_8_) {
              if ((double)local_48._0_8_ <= dVar29) {
                *(undefined8 *)(*(long *)(lVar5 + 0x40) + lVar20 * 8) = 0;
                iVar14 = *(int *)(lVar5 + 0x28);
                *(int *)(lVar5 + 0x28) = iVar14 + -1;
                *(undefined4 *)(lVar18 + -8 + lVar21 * 4) =
                     *(undefined4 *)(lVar18 + -4 + (long)iVar14 * 4);
              }
              else {
                dVar28 = *(double *)(*plVar9 + lVar20 * 8) - *(double *)(*plVar4 + lVar20 * 8);
                if (dVar1 < dVar28) {
                  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                  lVar17 = CONCAT44(extraout_var_12,iVar14);
                  dVar29 = *(double *)(*plVar4 + lVar20 * 8) + dVar1;
                  lVar18 = **(long **)(lVar17 + 0x6e0);
                  dVar23 = *(double *)(lVar18 + lVar20 * 8);
                  dVar28 = (double)-(ulong)(dVar29 < dVar23);
                  dVar23 = dVar23 - dVar29;
                  goto LAB_00235858;
                }
                dVar28 = dVar28 / dVar29;
                if (dVar28 <= max) {
                  dVar29 = -dVar29;
                  goto LAB_002358ce;
                }
              }
            }
            else {
              dVar28 = *(double *)(*plVar8 + lVar20 * 8) - *(double *)(*plVar4 + lVar20 * 8);
              if (dVar28 < (double)local_68._0_8_) {
                iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                lVar17 = CONCAT44(extraout_var_11,iVar14);
                dVar29 = *(double *)(*plVar4 + lVar20 * 8) - dVar1;
                lVar18 = **(long **)(lVar17 + 0x6d8);
                dVar23 = *(double *)(lVar18 + lVar20 * 8);
                dVar28 = dVar29 - dVar23;
                dVar23 = (double)-(ulong)(dVar23 < dVar29);
LAB_00235858:
                *(double *)(lVar17 + 0x380) =
                     (double)((ulong)dVar23 & (ulong)dVar28) + *(double *)(lVar17 + 0x380);
                *(double *)(lVar18 + lVar20 * 8) = dVar29;
                dVar23 = (double)local_a8._0_8_;
                uVar22 = local_a8._8_8_;
              }
              else {
                dVar28 = dVar28 / dVar29;
                if (dVar28 <= max) {
LAB_002358ce:
                  if (local_138 <= dVar29) {
                    iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                    enterId = SPxSolverBase<double>::id
                                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_13,iVar14),
                                         uVar2);
                    dVar23 = (double)local_a8._0_8_;
                    uVar22 = local_a8._8_8_;
                    local_154 = uVar2;
                    local_148 = dVar28;
                    local_138 = dVar29;
                  }
                }
              }
            }
            lVar21 = lVar21 + -1;
          } while (1 < lVar21);
        }
        if (0 < (long)*(int *)(lVar7 + 0x28)) {
          if (dVar23 <= local_70 * dVar23) {
            dVar23 = local_70 * dVar23;
          }
          local_88._8_8_ = uVar22;
          local_88._0_8_ = dVar23;
          local_48._8_4_ = (int)uVar22;
          local_48._0_8_ = -dVar23;
          local_48._12_4_ = (uint)(uVar22 >> 0x20) ^ 0x80000000;
          local_98 = 0xffffffff;
          lVar21 = (long)*(int *)(lVar7 + 0x28);
          do {
            lVar18 = *(long *)(lVar7 + 0x30);
            iVar14 = *(int *)(lVar18 + -4 + lVar21 * 4);
            lVar20 = (long)iVar14;
            dVar23 = *(double *)(*(long *)(lVar7 + 0x40) + lVar20 * 8);
            if (dVar23 <= (double)local_88._0_8_) {
              if ((double)local_48._0_8_ <= dVar23) {
                *(undefined8 *)(*(long *)(lVar7 + 0x40) + lVar20 * 8) = 0;
                iVar14 = *(int *)(lVar7 + 0x28);
                *(int *)(lVar7 + 0x28) = iVar14 + -1;
                *(undefined4 *)(lVar18 + -4 + lVar21 * 4) =
                     *(undefined4 *)(lVar18 + -4 + (long)iVar14 * 4);
              }
              else {
                dVar29 = *(double *)(*plVar11 + lVar20 * 8) - *(double *)(*plVar6 + lVar20 * 8);
                if (dVar1 < dVar29) {
                  iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                  lVar17 = CONCAT44(extraout_var_15,iVar14);
                  dVar29 = *(double *)(*plVar6 + lVar20 * 8) + dVar1;
                  lVar18 = **(long **)(lVar17 + 0x6f0);
                  dVar23 = *(double *)(lVar18 + lVar20 * 8);
                  dVar28 = (double)-(ulong)(dVar29 < dVar23);
                  dVar23 = dVar23 - dVar29;
                  goto LAB_00235ab8;
                }
                dVar29 = dVar29 / dVar23;
                if (dVar29 <= max) {
                  dVar23 = -dVar23;
                  goto LAB_00235b26;
                }
              }
            }
            else {
              dVar29 = *(double *)(*plVar10 + lVar20 * 8) - *(double *)(*plVar6 + lVar20 * 8);
              if ((double)local_68._0_8_ <= dVar29) {
                dVar29 = dVar29 / dVar23;
                if (dVar29 <= max) {
LAB_00235b26:
                  if (local_138 <= dVar23) {
                    iVar15 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                    enterId = SPxSolverBase<double>::coId
                                        ((SPxSolverBase<double> *)CONCAT44(extraout_var_16,iVar15),
                                         iVar14);
                    local_98 = (uint)(lVar21 + -1);
                    local_148 = dVar29;
                    local_138 = dVar23;
                  }
                }
              }
              else {
                iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
                lVar17 = CONCAT44(extraout_var_14,iVar14);
                dVar29 = *(double *)(*plVar6 + lVar20 * 8) - dVar1;
                lVar18 = **(long **)(lVar17 + 0x6e8);
                dVar23 = *(double *)(lVar18 + lVar20 * 8);
                dVar28 = dVar29 - dVar23;
                dVar23 = (double)-(ulong)(dVar23 < dVar29);
LAB_00235ab8:
                *(double *)(lVar17 + 0x380) =
                     (double)((ulong)dVar23 & (ulong)dVar28) + *(double *)(lVar17 + 0x380);
                *(double *)(lVar18 + lVar20 * 8) = dVar29;
              }
            }
            bVar13 = 1 < lVar21;
            lVar21 = lVar21 + -1;
          } while (bVar13);
        }
        iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        dVar23 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_17,iVar14) + 0x368))
                                   ((long *)CONCAT44(extraout_var_17,iVar14));
        uVar2 = local_98;
      } while ((dVar27 != dVar23) || (NAN(dVar27) || NAN(dVar23)));
      if (-1 < (int)local_98) {
        iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
        bVar13 = SPxSolverBase<double>::isBasic
                           ((SPxSolverBase<double> *)CONCAT44(extraout_var_18,iVar14),&enterId);
        if (!bVar13) break;
        lVar21 = *(long *)(lVar7 + 0x30);
        *(undefined8 *)(*(long *)(lVar7 + 0x40) + (long)*(int *)(lVar21 + (ulong)uVar2 * 4) * 8) = 0
        ;
        iVar14 = *(int *)(lVar7 + 0x28);
        *(int *)(lVar7 + 0x28) = iVar14 + -1;
        *(undefined4 *)(lVar21 + (ulong)uVar2 * 4) = *(undefined4 *)(lVar21 + -4 + (long)iVar14 * 4)
        ;
        goto LAB_002355f4;
      }
      if ((int)local_154 < 0) {
LAB_0023670b:
        *val = 0.0;
        enterId.super_DataKey = enterId.super_DataKey & 0xffffffff00000000;
        return (SPxId)enterId.super_DataKey;
      }
      iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
      lVar21 = *(long *)(CONCAT44(extraout_var_19,iVar14) + 0x480);
      lVar18 = *(long *)(lVar21 + 0x20);
      uVar22 = (ulong)local_154;
      lVar21 = (long)*(int *)(*(long *)(lVar21 + 0x28) + 4 + uVar22 * 8);
      iVar14 = *(int *)(lVar18 + 0xc + lVar21 * 0x28);
      if (iVar14 < 1) {
        dVar27 = 0.0;
      }
      else {
        pdVar16 = *(double **)(lVar18 + lVar21 * 0x28);
        iVar14 = iVar14 + 1;
        dVar29 = 0.0;
        dVar23 = 0.0;
        do {
          dVar28 = *pdVar16 * *(double *)(*plVar6 + (long)*(int *)(pdVar16 + 1) * 8);
          dVar27 = dVar23 + dVar28;
          dVar29 = dVar29 + (dVar28 - (dVar27 - dVar23)) + (dVar23 - (dVar27 - (dVar27 - dVar23)));
          pdVar16 = pdVar16 + 2;
          iVar14 = iVar14 + -1;
          dVar23 = dVar27;
        } while (1 < iVar14);
        dVar27 = dVar27 + dVar29;
      }
      *(double *)(*plVar4 + uVar22 * 8) = dVar27;
      iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
      bVar13 = SPxSolverBase<double>::isBasic
                         ((SPxSolverBase<double> *)CONCAT44(extraout_var_20,iVar14),&enterId);
      if (bVar13) {
        SSVectorBase<double>::setValue(local_38,local_154,0.0);
        goto LAB_002355f4;
      }
      dVar27 = *(double *)(*(long *)(lVar5 + 0x40) + uVar22 * 8);
      local_148 = *(double *)(*plVar4 + uVar22 * 8);
      if (dVar27 <= 0.0) {
        local_148 = *(double *)(*plVar9 + uVar22 * 8) - local_148;
        if ((-dVar27 < (double)local_b8._0_8_) &&
           (-local_148 < (this->super_SPxRatioTester<double>).delta)) {
          iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          lVar18 = CONCAT44(extraout_var_22,iVar14);
          dVar27 = *(double *)(*plVar4 + uVar22 * 8);
          uVar24 = SUB84(dVar27,0);
          uVar25 = (undefined4)((ulong)dVar27 >> 0x20);
          lVar21 = **(long **)(lVar18 + 0x6e0);
          dVar23 = *(double *)(lVar21 + uVar22 * 8);
          dVar29 = (double)-(ulong)(dVar27 < dVar23);
          dVar23 = dVar23 - dVar27;
          goto LAB_00235e10;
        }
      }
      else {
        local_148 = *(double *)(*plVar8 + uVar22 * 8) - local_148;
        if ((dVar27 < (double)local_b8._0_8_) &&
           (local_148 < (this->super_SPxRatioTester<double>).delta)) {
          iVar14 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
          lVar18 = CONCAT44(extraout_var_21,iVar14);
          dVar27 = *(double *)(*plVar4 + uVar22 * 8);
          uVar24 = SUB84(dVar27,0);
          uVar25 = (undefined4)((ulong)dVar27 >> 0x20);
          lVar21 = **(long **)(lVar18 + 0x6d8);
          dVar23 = *(double *)(lVar21 + uVar22 * 8);
          dVar29 = dVar27 - dVar23;
          dVar23 = (double)-(ulong)(dVar23 < dVar27);
LAB_00235e10:
          *(double *)(lVar18 + 0x380) =
               (double)((ulong)dVar23 & (ulong)dVar29) + *(double *)(lVar18 + 0x380);
          *(ulong *)(lVar21 + uVar22 * 8) = CONCAT44(uVar25,uVar24);
          uVar24 = local_b8._12_4_;
          local_b8._8_4_ = local_b8._8_4_;
          local_b8._0_8_ = local_b8._0_8_ * 0.5;
          local_b8._12_4_ = uVar24;
          goto LAB_002355f4;
        }
      }
      local_148 = local_148 / dVar27;
    } while (max < local_148);
  }
  *val = local_148;
  return (SPxId)enterId.super_DataKey;
}

Assistant:

SPxId SPxHarrisRT<R>::selectEnter(R& val, int, bool)
{
   int i, j;
   SPxId enterId;
   R stab, x, y;
   R max = 0.0;
   R sel = 0.0;
   R lastshift;
   R cuseeps;
   R ruseeps;
   R cmaxabs = 1;
   R rmaxabs = 1;
   int pnr, cnr;

   R minStability = this->tolerances()->scaleAccordingToEpsilon(1e-4);
   R epsilon      = this->solver()->epsilon();
   R degeneps     = degenerateEps();

   VectorBase<R>& pvec = this->solver()->pVec();
   SSVectorBase<R>& pupd = this->solver()->pVec().delta();

   VectorBase<R>& cvec = this->solver()->coPvec();
   SSVectorBase<R>& cupd = this->solver()->coPvec().delta();

   const VectorBase<R>& upb = this->solver()->upBound();
   const VectorBase<R>& lpb = this->solver()->lpBound();
   const VectorBase<R>& ucb = this->solver()->ucBound();
   const VectorBase<R>& lcb = this->solver()->lcBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   if(val > epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);

         // phase 1:
         maxDelta(
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         maxDelta(
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(-infinity);
         ruseeps = rmaxabs * 0.001 * epsilon;

         if(ruseeps < epsilon)
            ruseeps = epsilon;

         cuseeps = cmaxabs * 0.001 * epsilon;

         if(cuseeps < epsilon)
            cuseeps = epsilon;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI01 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI02 removing value {}\n", cupd[i]);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(x < minStability && sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(-x < minStability && -sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel > max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }
   else if(val < -epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);


         // phase 1:
         minDelta
         (
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         minDelta
         (
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(infinity);
         ruseeps = rmaxabs * epsilon * 0.001;
         cuseeps = cmaxabs * epsilon * 0.001;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI03 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI04 removing value {}\n", x);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(x < minStability && -sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(-x < minStability && sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel < max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }

   assert(max * val >= 0);
   assert(enterId.type() != SPxId::INVALID);

   val = sel;

   return enterId;
}